

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

char * get_full_name(c2m_ctx_t c2m_ctx,char *base,char *name,int dir_base_p)

{
  char cVar1;
  VARR_char *pVVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  FILE *__stream;
  
  pVVar2 = c2m_ctx->temp_string;
  if ((pVVar2 == (VARR_char *)0x0) || (pVVar2->varr == (char *)0x0)) {
LAB_001961a6:
    get_full_name_cold_4();
  }
  else {
    pVVar2->els_num = 0;
    if (*base == '\0') {
      if ((name != (char *)0x0) && (*name != '\0')) {
        return name;
      }
      __assert_fail("name != NULL && name[0] != \'\\0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x97c,"const char *get_full_name(c2m_ctx_t, const char *, const char *, int)");
    }
    if (dir_base_p == 0) {
      pcVar5 = strrchr(base,0x2f);
      if (pcVar5 == (char *)0x0) {
        add_to_temp_string(c2m_ctx,".");
LAB_00196165:
        add_to_temp_string(c2m_ctx,"/");
      }
      else {
        if (base <= pcVar5) {
          do {
            pVVar2 = c2m_ctx->temp_string;
            if (pVVar2->varr == (char *)0x0) {
              get_full_name_cold_1();
              goto LAB_001961a6;
            }
            cVar1 = *base;
            uVar6 = pVVar2->els_num + 1;
            if (pVVar2->size < uVar6) {
              sVar4 = (uVar6 >> 1) + uVar6;
              pcVar7 = (char *)realloc(pVVar2->varr,sVar4);
              pVVar2->varr = pcVar7;
              pVVar2->size = sVar4;
            }
            sVar3 = pVVar2->els_num;
            pVVar2->els_num = sVar3 + 1;
            pVVar2->varr[sVar3] = cVar1;
            base = base + 1;
          } while (base <= pcVar5);
        }
        pVVar2 = c2m_ctx->temp_string;
        pcVar5 = pVVar2->varr;
        if (pcVar5 == (char *)0x0) {
          get_full_name_cold_2();
          __stream = fopen(pcVar5,"r");
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          return (char *)(ulong)(__stream != (FILE *)0x0);
        }
        uVar6 = pVVar2->els_num + 1;
        if (pVVar2->size < uVar6) {
          sVar4 = (uVar6 >> 1) + uVar6;
          pcVar5 = (char *)realloc(pcVar5,sVar4);
          pVVar2->varr = pcVar5;
          pVVar2->size = sVar4;
        }
        sVar3 = pVVar2->els_num;
        pVVar2->els_num = sVar3 + 1;
        pVVar2->varr[sVar3] = '\0';
      }
    }
    else {
      sVar4 = strlen(base);
      if (sVar4 == 0) goto LAB_001961b0;
      add_to_temp_string(c2m_ctx,base);
      if (base[sVar4 - 1] != '/') goto LAB_00196165;
    }
    add_to_temp_string(c2m_ctx,name);
    if (c2m_ctx->temp_string != (VARR_char *)0x0) {
      return c2m_ctx->temp_string->varr;
    }
  }
  get_full_name_cold_3();
LAB_001961b0:
  __assert_fail("len > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x984,"const char *get_full_name(c2m_ctx_t, const char *, const char *, int)");
}

Assistant:

static const char *get_full_name (c2m_ctx_t c2m_ctx, const char *base, const char *name,
                                  int dir_base_p) {
  const char *str, *last, *last2, *slash = "/", *slash2 = NULL;
  size_t len;

  VARR_TRUNC (char, temp_string, 0);
  if (base == NULL || *base == '\0') {
    assert (name != NULL && name[0] != '\0');
    return name;
  }
#ifdef _WIN32
  slash2 = "\\";
#endif
  if (dir_base_p) {
    len = strlen (base);
    assert (len > 0);
    add_to_temp_string (c2m_ctx, base);
    if (base[len - 1] != slash[0]) add_to_temp_string (c2m_ctx, slash);
  } else {
    last = strrchr (base, slash[0]);
    last2 = slash2 != NULL ? strrchr (base, slash2[0]) : NULL;
    if (last2 != NULL && (last == NULL || last2 > last)) last = last2;
    if (last != NULL) {
      for (str = base; str <= last; str++) VARR_PUSH (char, temp_string, *str);
      VARR_PUSH (char, temp_string, '\0');
    } else {
      add_to_temp_string (c2m_ctx, ".");
      add_to_temp_string (c2m_ctx, slash);
    }
  }
  add_to_temp_string (c2m_ctx, name);
  return VARR_ADDR (char, temp_string);
}